

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_buffer_block_flattened(CompilerGLSL *this,SPIRVariable *var)

{
  uint *puVar1;
  bool *pbVar2;
  TypedID<(spirv_cross::Types)1> *pTVar3;
  bool bVar4;
  SPIRType *type;
  size_t sVar5;
  runtime_error *prVar6;
  BaseType basic_type;
  size_t buffer_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  string buffer_name;
  Bitset flags;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint local_a8 [8];
  undefined1 local_88 [28];
  TypeID local_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(var->super_IVariant).field_0xc);
  (*(this->super_Compiler)._vptr_Compiler[6])
            (&buffer_name,this,(ulong)(type->super_IVariant).self.id,0);
  sVar5 = Compiler::get_declared_struct_size(&this->super_Compiler,type);
  buffer_size = sVar5 + 0xf >> 4;
  bVar4 = Compiler::get_common_basic_type(&this->super_Compiler,type,&basic_type);
  if (!bVar4) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (prVar6,"All basic types in a flattened block must be the same.");
    *(undefined ***)prVar6 = &PTR__runtime_error_004faf50;
    __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  puVar1 = (uint *)(local_180 + 0x38);
  local_180._8_4_ = 0;
  local_180._0_8_ = &PTR__SPIRType_004faf78;
  local_180._12_4_ = 0x17;
  local_180._20_4_ = 0;
  local_180._28_4_ = 1;
  local_180._40_8_ = 0;
  local_180._48_8_ = 8;
  pbVar2 = (bool *)(local_180 + 0x70);
  local_180._96_8_ = 0;
  local_180._104_8_ = 8;
  local_180._120_4_ = 0;
  local_180[0x7c] = false;
  local_180[0x7d] = false;
  local_180._128_4_ = Generic;
  pTVar3 = (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0);
  local_180._144_8_ = 0;
  local_180._152_8_ = 8;
  local_b8 = 0;
  local_b0 = 8;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_88._0_7_ = 0;
  local_88._7_4_ = 0;
  local_88._12_4_ = 0;
  local_88._16_4_ = ImageFormatUnknown;
  local_88._20_4_ = AccessQualifierReadOnly;
  local_88._24_4_ = 0;
  local_6c.id = 0;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_180._16_4_ = basic_type;
  local_180._24_4_ = 4;
  local_180._32_8_ = puVar1;
  local_180._88_8_ = pbVar2;
  local_180._136_8_ = pTVar3;
  local_c0 = local_a8;
  if ((1 < basic_type - Int) && (basic_type != Float)) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (prVar6,"Basic types in a flattened UBO must be float, int or uint.");
    *(undefined ***)prVar6 = &PTR__runtime_error_004faf50;
    __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  ParsedIR::get_buffer_block_flags(&flags,&(this->super_Compiler).ir,var);
  flags_to_qualifiers_glsl_abi_cxx11_(&local_200,this,(SPIRType *)local_180,&flags);
  (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_220,this,local_180,0);
  statement<char_const(&)[9],std::__cxx11::string,std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],unsigned_long&,char_const(&)[3]>
            (this,(char (*) [9])"uniform ",&local_200,&local_220,(char (*) [2])0x3c91f1,&buffer_name
             ,(char (*) [2])0x3a6838,&buffer_size,(char (*) [3])0x3e5b35);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&flags.higher._M_h);
  local_180._0_8_ = &PTR__SPIRType_004faf78;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  local_180._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ != pTVar3) {
    free((void *)local_180._136_8_);
  }
  local_180._96_8_ = 0;
  if ((bool *)local_180._88_8_ != pbVar2) {
    free((void *)local_180._88_8_);
  }
  local_180._40_8_ = 0;
  if ((uint *)local_180._32_8_ != puVar1) {
    free((void *)local_180._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)buffer_name._M_dataplus._M_p != &buffer_name.field_2) {
    operator_delete(buffer_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_block_flattened(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	// Block names should never alias.
	auto buffer_name = to_name(type.self, false);
	size_t buffer_size = (get_declared_struct_size(type) + 15) / 16;

	SPIRType::BaseType basic_type;
	if (get_common_basic_type(type, basic_type))
	{
		SPIRType tmp { OpTypeVector };
		tmp.basetype = basic_type;
		tmp.vecsize = 4;
		if (basic_type != SPIRType::Float && basic_type != SPIRType::Int && basic_type != SPIRType::UInt)
			SPIRV_CROSS_THROW("Basic types in a flattened UBO must be float, int or uint.");

		auto flags = ir.get_buffer_block_flags(var);
		statement("uniform ", flags_to_qualifiers_glsl(tmp, flags), type_to_glsl(tmp), " ", buffer_name, "[",
		          buffer_size, "];");
	}
	else
		SPIRV_CROSS_THROW("All basic types in a flattened block must be the same.");
}